

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFNC.h
# Opt level: O2

char * GetPixelFormatName(PfncFormat format)

{
  switch(format) {
  case SCF1WBWG10:
    return "SCF1WBWG10";
  case 0x1100069:
  case 0x110006b:
  case 0x110006e:
  case 0x1100070:
  case 0x1100072:
  case 0x1100075:
  case 0x1100077:
  case 0x1100079:
  case 0x110007c:
  case 0x110007e:
  case 0x1100080:
    goto switchD_00131a1f_caseD_2400060;
  case SCF1WBWG12:
    return "SCF1WBWG12";
  case SCF1WBWG14:
    return "SCF1WBWG14";
  case SCF1WBWG16:
    return "SCF1WBWG16";
  case SCF1WGWB10:
    return "SCF1WGWB10";
  case SCF1WGWB12:
    return "SCF1WGWB12";
  case SCF1WGWB14:
    return "SCF1WGWB14";
  case SCF1WGWB16:
    return "SCF1WGWB16";
  case SCF1WGWR10:
    return "SCF1WGWR10";
  case SCF1WGWR12:
    return "SCF1WGWR12";
  case SCF1WGWR14:
    return "SCF1WGWR14";
  case SCF1WGWR16:
    return "SCF1WGWR16";
  case SCF1WRWG10:
    return "SCF1WRWG10";
  case SCF1WRWG12:
    return "SCF1WRWG12";
  case SCF1WRWG14:
    return "SCF1WRWG14";
  case SCF1WRWG16:
    return "SCF1WRWG16";
  default:
    switch(format) {
    case YCbCr601_422_10:
      return "YCbCr601_422_10";
    case 0x220008e:
    case 0x2200090:
    case 0x2200091:
    case 0x2200092:
    case 0x2200093:
    case 0x2200094:
    case 0x2200096:
    case 0x2200098:
    case 0x220009a:
    case 0x220009c:
    case 0x220009e:
    case 0x22000a0:
    case 0x22000a2:
    case 0x22000a4:
    case 0x22000a5:
    case 0x22000a6:
    case 0x22000a8:
    case 0x22000aa:
    case 0x22000ac:
      break;
    case YCbCr601_422_12:
      return "YCbCr601_422_12";
    case YCbCr709_422_10:
      return "YCbCr709_422_10";
    case YCbCr709_422_12:
      return "YCbCr709_422_12";
    case YCbCr422_10_CbYCrY:
      return "YCbCr422_10_CbYCrY";
    case YCbCr422_12_CbYCrY:
      return "YCbCr422_12_CbYCrY";
    case YCbCr601_422_10_CbYCrY:
      return "YCbCr601_422_10_CbYCrY";
    case YCbCr601_422_12_CbYCrY:
      return "YCbCr601_422_12_CbYCrY";
    case YCbCr709_422_10_CbYCrY:
      return "YCbCr709_422_10_CbYCrY";
    case YCbCr709_422_12_CbYCrY:
      return "YCbCr709_422_12_CbYCrY";
    case BiColorRGBG10:
      return "BiColorRGBG10";
    case BiColorBGRG10:
      return "BiColorBGRG10";
    case BiColorRGBG12:
      return "BiColorRGBG12";
    case BiColorBGRG12:
      return "BiColorBGRG12";
    default:
      switch(format) {
      case BayerGR14:
        return "BayerGR14";
      case BayerRG14:
        return "BayerRG14";
      case BayerGB14:
        return "BayerGB14";
      case BayerBG14:
        return "BayerBG14";
      case 0x110010d:
      case 0x110010e:
      case 0x110010f:
      case 0x1100110:
      case 0x1100111:
      case 0x1100112:
      case 0x1100113:
      case 0x1100114:
      case 0x1100115:
      case 0x1100116:
      case 0x1100117:
      case 0x110011a:
      case 0x110011b:
      case 0x110011c:
      case 0x110011d:
      case 0x110011e:
      case 0x110011f:
        break;
      case Data16:
        return "Data16";
      case Data16s:
        return "Data16s";
      case R10:
        return "R10";
      case R12:
        return "R12";
      case G10:
        return "G10";
      case G12:
        return "G12";
      case B10:
        return "B10";
      case B12:
        return "B12";
      default:
        switch(format) {
        case Mono10:
          return "Mono10";
        case 0x1100004:
        case 0x1100006:
        case 0x1100008:
        case 0x1100009:
        case 0x110000a:
        case 0x110000b:
          break;
        case Mono12:
          return "Mono12";
        case Mono16:
          return "Mono16";
        case BayerGR10:
          return "BayerGR10";
        case BayerRG10:
          return "BayerRG10";
        case BayerGB10:
          return "BayerGB10";
        case BayerBG10:
          return "BayerBG10";
        case BayerGR12:
          return "BayerGR12";
        case BayerRG12:
          return "BayerRG12";
        case BayerGB12:
          return "BayerGB12";
        case BayerBG12:
          return "BayerBG12";
        default:
          switch(format) {
          case YUV422_8:
            return "YUV422_8";
          case 0x2100033:
          case 0x2100034:
          case 0x2100037:
          case 0x2100038:
          case 0x2100039:
          case 0x210003a:
          case 0x210003c:
          case 0x210003d:
          case 0x210003f:
          case 0x2100040:
          case 0x2100042:
            break;
          case RGB565p:
            return "RGB565p";
          case BGR565p:
            return "BGR565p";
          case YCbCr422_8:
            return "YCbCr422_8";
          case YCbCr601_422_8:
            return "YCbCr601_422_8";
          case YCbCr709_422_8:
            return "YCbCr709_422_8";
          case YCbCr422_8_CbYCrY:
            return "YCbCr422_8_CbYCrY";
          case YCbCr601_422_8_CbYCrY:
            return "YCbCr601_422_8_CbYCrY";
          case YCbCr709_422_8_CbYCrY:
            return "YCbCr709_422_8_CbYCrY";
          default:
            switch(format) {
            case BayerGR10Packed:
              return "BayerGR10Packed";
            case BayerRG10Packed:
              return "BayerRG10Packed";
            case BayerGB10Packed:
              return "BayerGB10Packed";
            case BayerBG10Packed:
              return "BayerBG10Packed";
            case BayerGR12Packed:
              return "BayerGR12Packed";
            case BayerRG12Packed:
              return "BayerRG12Packed";
            case BayerGB12Packed:
              return "BayerGB12Packed";
            case BayerBG12Packed:
              return "BayerBG12Packed";
            }
            switch(format) {
            case RGB10:
              return "RGB10";
            case BGR10:
              return "BGR10";
            case RGB12:
              return "RGB12";
            case BGR12:
              return "BGR12";
            case 0x230001c:
            case 0x230001d:
            case 0x230001e:
            case 0x230001f:
            case 0x2300020:
            case 0x2300021:
              break;
            case RGB10_Planar:
              return "RGB10_Planar";
            case RGB12_Planar:
              return "RGB12_Planar";
            case RGB16_Planar:
              return "RGB16_Planar";
            default:
              switch(format) {
              case Mono8:
                return "Mono8";
              case Mono8s:
                return "Mono8s";
              case 0x1080003:
              case 0x1080004:
              case 0x1080005:
              case 0x1080006:
              case 0x1080007:
                break;
              case BayerGR8:
                return "BayerGR8";
              case BayerRG8:
                return "BayerRG8";
              case BayerGB8:
                return "BayerGB8";
              case BayerBG8:
                return "BayerBG8";
              default:
                switch(format) {
                case R10_Deprecated:
                  return "R10_Deprecated";
                case 0x10a00cb:
                case 0x10a00cc:
                case 0x10a00cd:
                case 0x10a00cf:
                case 0x10a00d0:
                case 0x10a00d1:
                case 0x10a00d3:
                case 0x10a00d4:
                  break;
                case G10_Deprecated:
                  return "G10_Deprecated";
                case B10_Deprecated:
                  return "B10_Deprecated";
                case Coord3D_A10p:
                  return "Coord3D_A10p";
                case Coord3D_B10p:
                  return "Coord3D_B10p";
                case Coord3D_C10p:
                  return "Coord3D_C10p";
                default:
                  switch(format) {
                  case G12_Deprecated:
                    return "G12_Deprecated";
                  case 0x10c00d0:
                  case 0x10c00d1:
                  case 0x10c00d2:
                  case 0x10c00d4:
                  case 0x10c00d5:
                  case 0x10c00d6:
                  case 0x10c00d7:
                    break;
                  case B12_Deprecated:
                    return "B12_Deprecated";
                  case Coord3D_A12p:
                    return "Coord3D_A12p";
                  case Coord3D_B12p:
                    return "Coord3D_B12p";
                  case Coord3D_C12p:
                    return "Coord3D_C12p";
                  default:
                    switch(format) {
                    case Mono14p:
                      return "Mono14p";
                    case BayerGR14p:
                      return "BayerGR14p";
                    case BayerRG14p:
                      return "BayerRG14p";
                    case BayerGB14p:
                      return "BayerGB14p";
                    case BayerBG14p:
                      return "BayerBG14p";
                    }
                    switch(format) {
                    case BayerGR4p:
                      return "BayerGR4p";
                    case BayerRG4p:
                      return "BayerRG4p";
                    case BayerGB4p:
                      return "BayerGB4p";
                    case BayerBG4p:
                      return "BayerBG4p";
                    }
                    switch(format) {
                    case Confidence1:
                      return "Confidence1";
                    case 0x10800c5:
                    case 0x10800c7:
                    case 0x10800c8:
                    case 0x10800ca:
                    case 0x10800cb:
                    case 0x10800cc:
                      break;
                    case Confidence8:
                      return "Confidence8";
                    case R8:
                      return "R8";
                    case G8:
                      return "G8";
                    default:
                      switch(format) {
                      case BayerBG10p:
                        return "BayerBG10p";
                      case 0x10a0053:
                      case 0x10a0055:
                      case 0x10a0057:
                        break;
                      case BayerGB10p:
                        return "BayerGB10p";
                      case BayerGR10p:
                        return "BayerGR10p";
                      case BayerRG10p:
                        return "BayerRG10p";
                      default:
                        switch(format) {
                        case BayerBG12p:
                          return "BayerBG12p";
                        case 0x10c0054:
                        case 0x10c0056:
                        case 0x10c0058:
                          break;
                        case BayerGB12p:
                          return "BayerGB12p";
                        case BayerGR12p:
                          return "BayerGR12p";
                        case BayerRG12p:
                          return "BayerRG12p";
                        default:
                          switch(format) {
                          case BayerGR16:
                            return "BayerGR16";
                          case BayerRG16:
                            return "BayerRG16";
                          case BayerGB16:
                            return "BayerGB16";
                          case BayerBG16:
                            return "BayerBG16";
                          }
                          switch(format) {
                          case BiColorRGBG12p:
                            return "BiColorRGBG12p";
                          case 0x21800ad:
                          case 0x21800af:
                          case 0x21800b0:
                          case 0x21800b1:
                            break;
                          case BiColorBGRG12p:
                            return "BiColorBGRG12p";
                          case Coord3D_ABC8:
                            return "Coord3D_ABC8";
                          case Coord3D_ABC8_Planar:
                            return "Coord3D_ABC8_Planar";
                          default:
                            switch(format) {
                            case RGBa8:
                              return "RGBa8";
                            case BGRa8:
                              return "BGRa8";
                            case 0x2200018:
                            case 0x2200019:
                            case 0x220001a:
                            case 0x220001b:
                              break;
                            case RGB10V1Packed:
                              return "RGB10V1Packed";
                            case RGB10p32:
                              return "RGB10p32";
                            default:
                              switch(format) {
                              case YCbCr2020_422_10:
                                return "YCbCr2020_422_10";
                              case YCbCr2020_422_10_CbYCrY:
                                return "YCbCr2020_422_10_CbYCrY";
                              case 0x22000fe:
                              case 0x22000ff:
                                break;
                              case YCbCr2020_422_12:
                                return "YCbCr2020_422_12";
                              case YCbCr2020_422_12_CbYCrY:
                                return "YCbCr2020_422_12_CbYCrY";
                              default:
                                switch(format) {
                                case YCbCr10_CbYCr:
                                  return "YCbCr10_CbYCr";
                                case 0x2300084:
                                case 0x2300086:
                                case 0x2300087:
                                case 0x2300088:
                                case 0x230008a:
                                  break;
                                case YCbCr12_CbYCr:
                                  return "YCbCr12_CbYCr";
                                case YCbCr601_10_CbYCr:
                                  return "YCbCr601_10_CbYCr";
                                case YCbCr601_12_CbYCr:
                                  return "YCbCr601_12_CbYCr";
                                default:
                                  switch(format) {
                                  case BGRa10:
                                    return "BGRa10";
                                  case 0x240004d:
                                  case 0x240004f:
                                    break;
                                  case BGRa12:
                                    return "BGRa12";
                                  case BGRa14:
                                    return "BGRa14";
                                  case BGRa16:
                                    return "BGRa16";
                                  default:
                                    switch(format) {
                                    case RGBa10:
                                      return "RGBa10";
                                    case 0x2400060:
                                    case 0x2400062:
                                      break;
                                    case RGBa12:
                                      return "RGBa12";
                                    case RGBa14:
                                      return "RGBa14";
                                    case RGBa16:
                                      return "RGBa16";
                                    default:
                                      if (format == InvalidPixelFormat) {
                                        return "InvalidPixelFormat";
                                      }
                                      if (format == Mono1p) {
                                        return "Mono1p";
                                      }
                                      if (format == Confidence1p) {
                                        return "Confidence1p";
                                      }
                                      if (format == Coord3D_ABC32f_Planar) {
                                        return "Coord3D_ABC32f_Planar";
                                      }
                                      if (format == Mono4p) {
                                        return "Mono4p";
                                      }
                                      if (format == SCF1WBWG8) {
                                        return "SCF1WBWG8";
                                      }
                                      if (format == SCF1WGWB8) {
                                        return "SCF1WGWB8";
                                      }
                                      if (format == SCF1WGWR8) {
                                        return "SCF1WGWR8";
                                      }
                                      if (format == SCF1WRWG8) {
                                        return "SCF1WRWG8";
                                      }
                                      if (format == Coord3D_A8) {
                                        return "Coord3D_A8";
                                      }
                                      if (format == Coord3D_B8) {
                                        return "Coord3D_B8";
                                      }
                                      if (format == Coord3D_C8) {
                                        return "Coord3D_C8";
                                      }
                                      if (format == B8) {
                                        return "B8";
                                      }
                                      if (format == Data8) {
                                        return "Data8";
                                      }
                                      if (format == Data8s) {
                                        return "Data8s";
                                      }
                                      if (format == Mono10p) {
                                        return "Mono10p";
                                      }
                                      if (format == SCF1WBWG10p) {
                                        return "SCF1WBWG10p";
                                      }
                                      if (format == SCF1WGWB10p) {
                                        return "SCF1WGWB10p";
                                      }
                                      if (format == SCF1WGWR10p) {
                                        return "SCF1WGWR10p";
                                      }
                                      if (format == SCF1WRWG10p) {
                                        return "SCF1WRWG10p";
                                      }
                                      if (format == Mono10Packed) {
                                        return "Mono10Packed";
                                      }
                                      if (format == Mono12Packed) {
                                        return "Mono12Packed";
                                      }
                                      if (format == Mono12p) {
                                        return "Mono12p";
                                      }
                                      if (format == SCF1WBWG12p) {
                                        return "SCF1WBWG12p";
                                      }
                                      if (format == SCF1WGWB12p) {
                                        return "SCF1WGWB12p";
                                      }
                                      if (format == SCF1WGWR12p) {
                                        return "SCF1WGWR12p";
                                      }
                                      if (format == SCF1WRWG12p) {
                                        return "SCF1WRWG12p";
                                      }
                                      if (format == R12_Deprecated) {
                                        return "R12_Deprecated";
                                      }
                                      if (format == Mono14) {
                                        return "Mono14";
                                      }
                                      if (format == Coord3D_A16) {
                                        return "Coord3D_A16";
                                      }
                                      if (format == Coord3D_B16) {
                                        return "Coord3D_B16";
                                      }
                                      if (format == Coord3D_C16) {
                                        return "Coord3D_C16";
                                      }
                                      if (format == Confidence16) {
                                        return "Confidence16";
                                      }
                                      if (format == R16) {
                                        return "R16";
                                      }
                                      if (format == G16) {
                                        return "G16";
                                      }
                                      if (format == B16) {
                                        return "B16";
                                      }
                                      if (format == Coord3D_A32f) {
                                        return "Coord3D_A32f";
                                      }
                                      if (format == Coord3D_B32f) {
                                        return "Coord3D_B32f";
                                      }
                                      if (format == Coord3D_C32f) {
                                        return "Coord3D_C32f";
                                      }
                                      if (format == Confidence32f) {
                                        return "Confidence32f";
                                      }
                                      if (format == Mono32) {
                                        return "Mono32";
                                      }
                                      if (format == Data32) {
                                        return "Data32";
                                      }
                                      if (format == Data32s) {
                                        return "Data32s";
                                      }
                                      if (format == Data32f) {
                                        return "Data32f";
                                      }
                                      if (format == Data64) {
                                        return "Data64";
                                      }
                                      if (format == Data64s) {
                                        return "Data64s";
                                      }
                                      if (format == Data64f) {
                                        return "Data64f";
                                      }
                                      if (format == YUV411_8_UYYVYY) {
                                        return "YUV411_8_UYYVYY";
                                      }
                                      if (format == YCbCr411_8_CbYYCrYY) {
                                        return "YCbCr411_8_CbYYCrYY";
                                      }
                                      if (format == YCbCr601_411_8_CbYYCrYY) {
                                        return "YCbCr601_411_8_CbYYCrYY";
                                      }
                                      if (format == YCbCr709_411_8_CbYYCrYY) {
                                        return "YCbCr709_411_8_CbYYCrYY";
                                      }
                                      if (format == YCbCr411_8) {
                                        return "YCbCr411_8";
                                      }
                                      if (format == YCbCr2020_411_8_CbYYCrYY) {
                                        return "YCbCr2020_411_8_CbYYCrYY";
                                      }
                                      if (format == YCbCr420_8_YY_CbCr_Semiplanar) {
                                        return "YCbCr420_8_YY_CbCr_Semiplanar";
                                      }
                                      if (format == YCbCr420_8_YY_CrCb_Semiplanar) {
                                        return "YCbCr420_8_YY_CrCb_Semiplanar";
                                      }
                                      if (format == YUV422_8_UYVY) {
                                        return "YUV422_8_UYVY";
                                      }
                                      if (format == BiColorRGBG8) {
                                        return "BiColorRGBG8";
                                      }
                                      if (format == BiColorBGRG8) {
                                        return "BiColorBGRG8";
                                      }
                                      if (format == Coord3D_AC8) {
                                        return "Coord3D_AC8";
                                      }
                                      if (format == Coord3D_AC8_Planar) {
                                        return "Coord3D_AC8_Planar";
                                      }
                                      if (format == YCbCr2020_422_8) {
                                        return "YCbCr2020_422_8";
                                      }
                                      if (format == YCbCr2020_422_8_CbYCrY) {
                                        return "YCbCr2020_422_8_CbYCrY";
                                      }
                                      if (format == YCbCr422_8_YY_CbCr_Semiplanar) {
                                        return "YCbCr422_8_YY_CbCr_Semiplanar";
                                      }
                                      if (format == YCbCr422_8_YY_CrCb_Semiplanar) {
                                        return "YCbCr422_8_YY_CrCb_Semiplanar";
                                      }
                                      if (format == YCbCr422_10p) {
                                        return "YCbCr422_10p";
                                      }
                                      if (format == YCbCr601_422_10p) {
                                        return "YCbCr601_422_10p";
                                      }
                                      if (format == YCbCr709_422_10p) {
                                        return "YCbCr709_422_10p";
                                      }
                                      if (format == YCbCr422_10p_CbYCrY) {
                                        return "YCbCr422_10p_CbYCrY";
                                      }
                                      if (format == YCbCr601_422_10p_CbYCrY) {
                                        return "YCbCr601_422_10p_CbYCrY";
                                      }
                                      if (format == YCbCr709_422_10p_CbYCrY) {
                                        return "YCbCr709_422_10p_CbYCrY";
                                      }
                                      if (format == BiColorRGBG10p) {
                                        return "BiColorRGBG10p";
                                      }
                                      if (format == BiColorBGRG10p) {
                                        return "BiColorBGRG10p";
                                      }
                                      if (format == Coord3D_AC10p) {
                                        return "Coord3D_AC10p";
                                      }
                                      if (format == Coord3D_AC10p_Planar) {
                                        return "Coord3D_AC10p_Planar";
                                      }
                                      if (format == YCbCr2020_422_10p) {
                                        return "YCbCr2020_422_10p";
                                      }
                                      if (format == YCbCr2020_422_10p_CbYCrY) {
                                        return "YCbCr2020_422_10p_CbYCrY";
                                      }
                                      if (format == RGB8) {
                                        return "RGB8";
                                      }
                                      if (format == BGR8) {
                                        return "BGR8";
                                      }
                                      if (format == YUV8_UYV) {
                                        return "YUV8_UYV";
                                      }
                                      if (format == RGB8_Planar) {
                                        return "RGB8_Planar";
                                      }
                                      if (format == YCbCr8_CbYCr) {
                                        return "YCbCr8_CbYCr";
                                      }
                                      if (format == YCbCr601_8_CbYCr) {
                                        return "YCbCr601_8_CbYCr";
                                      }
                                      if (format == YCbCr709_8_CbYCr) {
                                        return "YCbCr709_8_CbYCr";
                                      }
                                      if (format == YCbCr8) {
                                        return "YCbCr8";
                                      }
                                      if (format == YCbCr422_12p) {
                                        return "YCbCr422_12p";
                                      }
                                      if (format == YCbCr601_422_12p) {
                                        return "YCbCr601_422_12p";
                                      }
                                      if (format == YCbCr709_422_12p) {
                                        return "YCbCr709_422_12p";
                                      }
                                      if (format == YCbCr422_12p_CbYCrY) {
                                        return "YCbCr422_12p_CbYCrY";
                                      }
                                      if (format == YCbCr601_422_12p_CbYCrY) {
                                        return "YCbCr601_422_12p_CbYCrY";
                                      }
                                      if (format == YCbCr709_422_12p_CbYCrY) {
                                        return "YCbCr709_422_12p_CbYCrY";
                                      }
                                      if (format == Coord3D_AC12p) {
                                        return "Coord3D_AC12p";
                                      }
                                      if (format == Coord3D_AC12p_Planar) {
                                        return "Coord3D_AC12p_Planar";
                                      }
                                      if (format == YCbCr2020_8_CbYCr) {
                                        return "YCbCr2020_8_CbYCr";
                                      }
                                      if (format == YCbCr2020_422_12p) {
                                        return "YCbCr2020_422_12p";
                                      }
                                      if (format == YCbCr2020_422_12p_CbYCrY) {
                                        return "YCbCr2020_422_12p_CbYCrY";
                                      }
                                      if (format == BGR10p) {
                                        return "BGR10p";
                                      }
                                      if (format == RGB10p) {
                                        return "RGB10p";
                                      }
                                      if (format == YCbCr10p_CbYCr) {
                                        return "YCbCr10p_CbYCr";
                                      }
                                      if (format == YCbCr601_10p_CbYCr) {
                                        return "YCbCr601_10p_CbYCr";
                                      }
                                      if (format == YCbCr709_10p_CbYCr) {
                                        return "YCbCr709_10p_CbYCr";
                                      }
                                      if (format == Coord3D_ABC10p) {
                                        return "Coord3D_ABC10p";
                                      }
                                      if (format == Coord3D_ABC10p_Planar) {
                                        return "Coord3D_ABC10p_Planar";
                                      }
                                      if (format == YCbCr2020_10p_CbYCr) {
                                        return "YCbCr2020_10p_CbYCr";
                                      }
                                      if (format == YCbCr422_10) {
                                        return "YCbCr422_10";
                                      }
                                      if (format == YCbCr422_12) {
                                        return "YCbCr422_12";
                                      }
                                      if (format == Coord3D_AC16) {
                                        return "Coord3D_AC16";
                                      }
                                      if (format == Coord3D_AC16_Planar) {
                                        return "Coord3D_AC16_Planar";
                                      }
                                      if (format == RGB12V1Packed) {
                                        return "RGB12V1Packed";
                                      }
                                      if (format == BGR12p) {
                                        return "BGR12p";
                                      }
                                      if (format == RGB12p) {
                                        return "RGB12p";
                                      }
                                      if (format == YCbCr12p_CbYCr) {
                                        return "YCbCr12p_CbYCr";
                                      }
                                      if (format == YCbCr601_12p_CbYCr) {
                                        return "YCbCr601_12p_CbYCr";
                                      }
                                      if (format == YCbCr709_12p_CbYCr) {
                                        return "YCbCr709_12p_CbYCr";
                                      }
                                      if (format == Coord3D_ABC12p) {
                                        return "Coord3D_ABC12p";
                                      }
                                      if (format == Coord3D_ABC12p_Planar) {
                                        return "Coord3D_ABC12p_Planar";
                                      }
                                      if (format == YCbCr2020_12p_CbYCr) {
                                        return "YCbCr2020_12p_CbYCr";
                                      }
                                      if (format == BGRa10p) {
                                        return "BGRa10p";
                                      }
                                      if (format == RGBa10p) {
                                        return "RGBa10p";
                                      }
                                      if (format == RGB16) {
                                        return "RGB16";
                                      }
                                      if (format == BGR14) {
                                        return "BGR14";
                                      }
                                      if (format == BGR16) {
                                        return "BGR16";
                                      }
                                      if (format == BGRa12p) {
                                        return "BGRa12p";
                                      }
                                      if (format == RGB14) {
                                        return "RGB14";
                                      }
                                      if (format == RGBa12p) {
                                        return "RGBa12p";
                                      }
                                      if (format == YCbCr709_10_CbYCr) {
                                        return "YCbCr709_10_CbYCr";
                                      }
                                      if (format == YCbCr709_12_CbYCr) {
                                        return "YCbCr709_12_CbYCr";
                                      }
                                      if (format == Coord3D_ABC16) {
                                        return "Coord3D_ABC16";
                                      }
                                      if (format == Coord3D_ABC16_Planar) {
                                        return "Coord3D_ABC16_Planar";
                                      }
                                      if (format == YCbCr2020_10_CbYCr) {
                                        return "YCbCr2020_10_CbYCr";
                                      }
                                      if (format == YCbCr2020_12_CbYCr) {
                                        return "YCbCr2020_12_CbYCr";
                                      }
                                      if (format == Coord3D_AC32f) {
                                        return "Coord3D_AC32f";
                                      }
                                      if (format == Coord3D_AC32f_Planar) {
                                        return "Coord3D_AC32f_Planar";
                                      }
                                      if (format == Coord3D_ABC32f) {
                                        return "Coord3D_ABC32f";
                                      }
                                      if (format == Mono2p) {
                                        return "Mono2p";
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
switchD_00131a1f_caseD_2400060:
    return "UnknownPixelFormat";
  }
}

Assistant:

static PFNC_INLINE const char* GetPixelFormatName (PfncFormat format)
{
  switch (format)
  {
    case Mono1p:                                  return "Mono1p";
    case Mono2p:                                  return "Mono2p";
    case Mono4p:                                  return "Mono4p";
    case Mono8:                                   return "Mono8";
    case Mono8s:                                  return "Mono8s";
    case Mono10:                                  return "Mono10";
    case Mono10p:                                 return "Mono10p";
    case Mono12:                                  return "Mono12";
    case Mono12p:                                 return "Mono12p";
    case Mono14:                                  return "Mono14";
    case Mono14p:                                 return "Mono14p";
    case Mono16:                                  return "Mono16";
    case Mono32:                                  return "Mono32";
    case BayerBG4p:                               return "BayerBG4p";
    case BayerBG8:                                return "BayerBG8";
    case BayerBG10:                               return "BayerBG10";
    case BayerBG10p:                              return "BayerBG10p";
    case BayerBG12:                               return "BayerBG12";
    case BayerBG12p:                              return "BayerBG12p";
    case BayerBG14:                               return "BayerBG14";
    case BayerBG14p:                              return "BayerBG14p";
    case BayerBG16:                               return "BayerBG16";
    case BayerGB4p:                               return "BayerGB4p";
    case BayerGB8:                                return "BayerGB8";
    case BayerGB10:                               return "BayerGB10";
    case BayerGB10p:                              return "BayerGB10p";
    case BayerGB12:                               return "BayerGB12";
    case BayerGB12p:                              return "BayerGB12p";
    case BayerGB14:                               return "BayerGB14";
    case BayerGB14p:                              return "BayerGB14p";
    case BayerGB16:                               return "BayerGB16";
    case BayerGR4p:                               return "BayerGR4p";
    case BayerGR8:                                return "BayerGR8";
    case BayerGR10:                               return "BayerGR10";
    case BayerGR10p:                              return "BayerGR10p";
    case BayerGR12:                               return "BayerGR12";
    case BayerGR12p:                              return "BayerGR12p";
    case BayerGR14:                               return "BayerGR14";
    case BayerGR14p:                              return "BayerGR14p";
    case BayerGR16:                               return "BayerGR16";
    case BayerRG4p:                               return "BayerRG4p";
    case BayerRG8:                                return "BayerRG8";
    case BayerRG10:                               return "BayerRG10";
    case BayerRG10p:                              return "BayerRG10p";
    case BayerRG12:                               return "BayerRG12";
    case BayerRG12p:                              return "BayerRG12p";
    case BayerRG14:                               return "BayerRG14";
    case BayerRG14p:                              return "BayerRG14p";
    case BayerRG16:                               return "BayerRG16";
    case RGBa8:                                   return "RGBa8";
    case RGBa10:                                  return "RGBa10";
    case RGBa10p:                                 return "RGBa10p";
    case RGBa12:                                  return "RGBa12";
    case RGBa12p:                                 return "RGBa12p";
    case RGBa14:                                  return "RGBa14";
    case RGBa16:                                  return "RGBa16";
    case RGB8:                                    return "RGB8";
    case RGB8_Planar:                             return "RGB8_Planar";
    case RGB10:                                   return "RGB10";
    case RGB10_Planar:                            return "RGB10_Planar";
    case RGB10p:                                  return "RGB10p";
    case RGB10p32:                                return "RGB10p32";
    case RGB12:                                   return "RGB12";
    case RGB12_Planar:                            return "RGB12_Planar";
    case RGB12p:                                  return "RGB12p";
    case RGB14:                                   return "RGB14";
    case RGB16:                                   return "RGB16";
    case RGB16_Planar:                            return "RGB16_Planar";
    case RGB565p:                                 return "RGB565p";
    case BGRa8:                                   return "BGRa8";
    case BGRa10:                                  return "BGRa10";
    case BGRa10p:                                 return "BGRa10p";
    case BGRa12:                                  return "BGRa12";
    case BGRa12p:                                 return "BGRa12p";
    case BGRa14:                                  return "BGRa14";
    case BGRa16:                                  return "BGRa16";
    case BGR8:                                    return "BGR8";
    case BGR10:                                   return "BGR10";
    case BGR10p:                                  return "BGR10p";
    case BGR12:                                   return "BGR12";
    case BGR12p:                                  return "BGR12p";
    case BGR14:                                   return "BGR14";
    case BGR16:                                   return "BGR16";
    case BGR565p:                                 return "BGR565p";
    case R8:                                      return "R8";
    case R10:                                     return "R10";
    case R10_Deprecated:                          return "R10_Deprecated";
    case R12:                                     return "R12";
    case R12_Deprecated:                          return "R12_Deprecated";
    case R16:                                     return "R16";
    case G8:                                      return "G8";
    case G10:                                     return "G10";
    case G10_Deprecated:                          return "G10_Deprecated";
    case G12:                                     return "G12";
    case G12_Deprecated:                          return "G12_Deprecated";
    case G16:                                     return "G16";
    case B8:                                      return "B8";
    case B10:                                     return "B10";
    case B10_Deprecated:                          return "B10_Deprecated";
    case B12:                                     return "B12";
    case B12_Deprecated:                          return "B12_Deprecated";
    case B16:                                     return "B16";
    case Coord3D_ABC8:                            return "Coord3D_ABC8";
    case Coord3D_ABC8_Planar:                     return "Coord3D_ABC8_Planar";
    case Coord3D_ABC10p:                          return "Coord3D_ABC10p";
    case Coord3D_ABC10p_Planar:                   return "Coord3D_ABC10p_Planar";
    case Coord3D_ABC12p:                          return "Coord3D_ABC12p";
    case Coord3D_ABC12p_Planar:                   return "Coord3D_ABC12p_Planar";
    case Coord3D_ABC16:                           return "Coord3D_ABC16";
    case Coord3D_ABC16_Planar:                    return "Coord3D_ABC16_Planar";
    case Coord3D_ABC32f:                          return "Coord3D_ABC32f";
    case Coord3D_ABC32f_Planar:                   return "Coord3D_ABC32f_Planar";
    case Coord3D_AC8:                             return "Coord3D_AC8";
    case Coord3D_AC8_Planar:                      return "Coord3D_AC8_Planar";
    case Coord3D_AC10p:                           return "Coord3D_AC10p";
    case Coord3D_AC10p_Planar:                    return "Coord3D_AC10p_Planar";
    case Coord3D_AC12p:                           return "Coord3D_AC12p";
    case Coord3D_AC12p_Planar:                    return "Coord3D_AC12p_Planar";
    case Coord3D_AC16:                            return "Coord3D_AC16";
    case Coord3D_AC16_Planar:                     return "Coord3D_AC16_Planar";
    case Coord3D_AC32f:                           return "Coord3D_AC32f";
    case Coord3D_AC32f_Planar:                    return "Coord3D_AC32f_Planar";
    case Coord3D_A8:                              return "Coord3D_A8";
    case Coord3D_A10p:                            return "Coord3D_A10p";
    case Coord3D_A12p:                            return "Coord3D_A12p";
    case Coord3D_A16:                             return "Coord3D_A16";
    case Coord3D_A32f:                            return "Coord3D_A32f";
    case Coord3D_B8:                              return "Coord3D_B8";
    case Coord3D_B10p:                            return "Coord3D_B10p";
    case Coord3D_B12p:                            return "Coord3D_B12p";
    case Coord3D_B16:                             return "Coord3D_B16";
    case Coord3D_B32f:                            return "Coord3D_B32f";
    case Coord3D_C8:                              return "Coord3D_C8";
    case Coord3D_C10p:                            return "Coord3D_C10p";
    case Coord3D_C12p:                            return "Coord3D_C12p";
    case Coord3D_C16:                             return "Coord3D_C16";
    case Coord3D_C32f:                            return "Coord3D_C32f";
    case Confidence1:                             return "Confidence1";
    case Confidence1p:                            return "Confidence1p";
    case Confidence8:                             return "Confidence8";
    case Confidence16:                            return "Confidence16";
    case Confidence32f:                           return "Confidence32f";
    case BiColorBGRG8:                            return "BiColorBGRG8";
    case BiColorBGRG10:                           return "BiColorBGRG10";
    case BiColorBGRG10p:                          return "BiColorBGRG10p";
    case BiColorBGRG12:                           return "BiColorBGRG12";
    case BiColorBGRG12p:                          return "BiColorBGRG12p";
    case BiColorRGBG8:                            return "BiColorRGBG8";
    case BiColorRGBG10:                           return "BiColorRGBG10";
    case BiColorRGBG10p:                          return "BiColorRGBG10p";
    case BiColorRGBG12:                           return "BiColorRGBG12";
    case BiColorRGBG12p:                          return "BiColorRGBG12p";
    case Data8:                                   return "Data8";
    case Data8s:                                  return "Data8s";
    case Data16:                                  return "Data16";
    case Data16s:                                 return "Data16s";
    case Data32:                                  return "Data32";
    case Data32f:                                 return "Data32f";
    case Data32s:                                 return "Data32s";
    case Data64:                                  return "Data64";
    case Data64f:                                 return "Data64f";
    case Data64s:                                 return "Data64s";
    case SCF1WBWG8:                               return "SCF1WBWG8";
    case SCF1WBWG10:                              return "SCF1WBWG10";
    case SCF1WBWG10p:                             return "SCF1WBWG10p";
    case SCF1WBWG12:                              return "SCF1WBWG12";
    case SCF1WBWG12p:                             return "SCF1WBWG12p";
    case SCF1WBWG14:                              return "SCF1WBWG14";
    case SCF1WBWG16:                              return "SCF1WBWG16";
    case SCF1WGWB8:                               return "SCF1WGWB8";
    case SCF1WGWB10:                              return "SCF1WGWB10";
    case SCF1WGWB10p:                             return "SCF1WGWB10p";
    case SCF1WGWB12:                              return "SCF1WGWB12";
    case SCF1WGWB12p:                             return "SCF1WGWB12p";
    case SCF1WGWB14:                              return "SCF1WGWB14";
    case SCF1WGWB16:                              return "SCF1WGWB16";
    case SCF1WGWR8:                               return "SCF1WGWR8";
    case SCF1WGWR10:                              return "SCF1WGWR10";
    case SCF1WGWR10p:                             return "SCF1WGWR10p";
    case SCF1WGWR12:                              return "SCF1WGWR12";
    case SCF1WGWR12p:                             return "SCF1WGWR12p";
    case SCF1WGWR14:                              return "SCF1WGWR14";
    case SCF1WGWR16:                              return "SCF1WGWR16";
    case SCF1WRWG8:                               return "SCF1WRWG8";
    case SCF1WRWG10:                              return "SCF1WRWG10";
    case SCF1WRWG10p:                             return "SCF1WRWG10p";
    case SCF1WRWG12:                              return "SCF1WRWG12";
    case SCF1WRWG12p:                             return "SCF1WRWG12p";
    case SCF1WRWG14:                              return "SCF1WRWG14";
    case SCF1WRWG16:                              return "SCF1WRWG16";
    case YCbCr8:                                  return "YCbCr8";
    case YCbCr8_CbYCr:                            return "YCbCr8_CbYCr";
    case YCbCr10_CbYCr:                           return "YCbCr10_CbYCr";
    case YCbCr10p_CbYCr:                          return "YCbCr10p_CbYCr";
    case YCbCr12_CbYCr:                           return "YCbCr12_CbYCr";
    case YCbCr12p_CbYCr:                          return "YCbCr12p_CbYCr";
    case YCbCr411_8:                              return "YCbCr411_8";
    case YCbCr411_8_CbYYCrYY:                     return "YCbCr411_8_CbYYCrYY";
    case YCbCr420_8_YY_CbCr_Semiplanar:           return "YCbCr420_8_YY_CbCr_Semiplanar";
    case YCbCr420_8_YY_CrCb_Semiplanar:           return "YCbCr420_8_YY_CrCb_Semiplanar";
    case YCbCr422_8:                              return "YCbCr422_8";
    case YCbCr422_8_CbYCrY:                       return "YCbCr422_8_CbYCrY";
    case YCbCr422_8_YY_CbCr_Semiplanar:           return "YCbCr422_8_YY_CbCr_Semiplanar";
    case YCbCr422_8_YY_CrCb_Semiplanar:           return "YCbCr422_8_YY_CrCb_Semiplanar";
    case YCbCr422_10:                             return "YCbCr422_10";
    case YCbCr422_10_CbYCrY:                      return "YCbCr422_10_CbYCrY";
    case YCbCr422_10p:                            return "YCbCr422_10p";
    case YCbCr422_10p_CbYCrY:                     return "YCbCr422_10p_CbYCrY";
    case YCbCr422_12:                             return "YCbCr422_12";
    case YCbCr422_12_CbYCrY:                      return "YCbCr422_12_CbYCrY";
    case YCbCr422_12p:                            return "YCbCr422_12p";
    case YCbCr422_12p_CbYCrY:                     return "YCbCr422_12p_CbYCrY";
    case YCbCr601_8_CbYCr:                        return "YCbCr601_8_CbYCr";
    case YCbCr601_10_CbYCr:                       return "YCbCr601_10_CbYCr";
    case YCbCr601_10p_CbYCr:                      return "YCbCr601_10p_CbYCr";
    case YCbCr601_12_CbYCr:                       return "YCbCr601_12_CbYCr";
    case YCbCr601_12p_CbYCr:                      return "YCbCr601_12p_CbYCr";
    case YCbCr601_411_8_CbYYCrYY:                 return "YCbCr601_411_8_CbYYCrYY";
    case YCbCr601_422_8:                          return "YCbCr601_422_8";
    case YCbCr601_422_8_CbYCrY:                   return "YCbCr601_422_8_CbYCrY";
    case YCbCr601_422_10:                         return "YCbCr601_422_10";
    case YCbCr601_422_10_CbYCrY:                  return "YCbCr601_422_10_CbYCrY";
    case YCbCr601_422_10p:                        return "YCbCr601_422_10p";
    case YCbCr601_422_10p_CbYCrY:                 return "YCbCr601_422_10p_CbYCrY";
    case YCbCr601_422_12:                         return "YCbCr601_422_12";
    case YCbCr601_422_12_CbYCrY:                  return "YCbCr601_422_12_CbYCrY";
    case YCbCr601_422_12p:                        return "YCbCr601_422_12p";
    case YCbCr601_422_12p_CbYCrY:                 return "YCbCr601_422_12p_CbYCrY";
    case YCbCr709_8_CbYCr:                        return "YCbCr709_8_CbYCr";
    case YCbCr709_10_CbYCr:                       return "YCbCr709_10_CbYCr";
    case YCbCr709_10p_CbYCr:                      return "YCbCr709_10p_CbYCr";
    case YCbCr709_12_CbYCr:                       return "YCbCr709_12_CbYCr";
    case YCbCr709_12p_CbYCr:                      return "YCbCr709_12p_CbYCr";
    case YCbCr709_411_8_CbYYCrYY:                 return "YCbCr709_411_8_CbYYCrYY";
    case YCbCr709_422_8:                          return "YCbCr709_422_8";
    case YCbCr709_422_8_CbYCrY:                   return "YCbCr709_422_8_CbYCrY";
    case YCbCr709_422_10:                         return "YCbCr709_422_10";
    case YCbCr709_422_10_CbYCrY:                  return "YCbCr709_422_10_CbYCrY";
    case YCbCr709_422_10p:                        return "YCbCr709_422_10p";
    case YCbCr709_422_10p_CbYCrY:                 return "YCbCr709_422_10p_CbYCrY";
    case YCbCr709_422_12:                         return "YCbCr709_422_12";
    case YCbCr709_422_12_CbYCrY:                  return "YCbCr709_422_12_CbYCrY";
    case YCbCr709_422_12p:                        return "YCbCr709_422_12p";
    case YCbCr709_422_12p_CbYCrY:                 return "YCbCr709_422_12p_CbYCrY";
    case YCbCr2020_8_CbYCr:                       return "YCbCr2020_8_CbYCr";
    case YCbCr2020_10_CbYCr:                      return "YCbCr2020_10_CbYCr";
    case YCbCr2020_10p_CbYCr:                     return "YCbCr2020_10p_CbYCr";
    case YCbCr2020_12_CbYCr:                      return "YCbCr2020_12_CbYCr";
    case YCbCr2020_12p_CbYCr:                     return "YCbCr2020_12p_CbYCr";
    case YCbCr2020_411_8_CbYYCrYY:                return "YCbCr2020_411_8_CbYYCrYY";
    case YCbCr2020_422_8:                         return "YCbCr2020_422_8";
    case YCbCr2020_422_8_CbYCrY:                  return "YCbCr2020_422_8_CbYCrY";
    case YCbCr2020_422_10:                        return "YCbCr2020_422_10";
    case YCbCr2020_422_10_CbYCrY:                 return "YCbCr2020_422_10_CbYCrY";
    case YCbCr2020_422_10p:                       return "YCbCr2020_422_10p";
    case YCbCr2020_422_10p_CbYCrY:                return "YCbCr2020_422_10p_CbYCrY";
    case YCbCr2020_422_12:                        return "YCbCr2020_422_12";
    case YCbCr2020_422_12_CbYCrY:                 return "YCbCr2020_422_12_CbYCrY";
    case YCbCr2020_422_12p:                       return "YCbCr2020_422_12p";
    case YCbCr2020_422_12p_CbYCrY:                return "YCbCr2020_422_12p_CbYCrY";
    case YUV8_UYV:                                return "YUV8_UYV";
    case YUV411_8_UYYVYY:                         return "YUV411_8_UYYVYY";
    case YUV422_8:                                return "YUV422_8";
    case YUV422_8_UYVY:                           return "YUV422_8_UYVY";
    case Mono10Packed:                            return "Mono10Packed";
    case Mono12Packed:                            return "Mono12Packed";
    case BayerBG10Packed:                         return "BayerBG10Packed";
    case BayerBG12Packed:                         return "BayerBG12Packed";
    case BayerGB10Packed:                         return "BayerGB10Packed";
    case BayerGB12Packed:                         return "BayerGB12Packed";
    case BayerGR10Packed:                         return "BayerGR10Packed";
    case BayerGR12Packed:                         return "BayerGR12Packed";
    case BayerRG10Packed:                         return "BayerRG10Packed";
    case BayerRG12Packed:                         return "BayerRG12Packed";
    case RGB10V1Packed:                           return "RGB10V1Packed";
    case RGB12V1Packed:                           return "RGB12V1Packed";

    case InvalidPixelFormat: return "InvalidPixelFormat";

    default: return "UnknownPixelFormat";
  }
}